

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuBackend.cpp
# Opt level: O1

Value __thiscall xmrig::CpuBackend::toJSON(CpuBackend *this,Document *doc)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  Ch *pCVar1;
  byte bVar2;
  bool bVar3;
  AlgoVariant value;
  Config *this_00;
  CpuConfig *pCVar4;
  size_t sVar5;
  Document *doc_00;
  long in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar6;
  Document *pDVar7;
  CpuLaunchData *data;
  CpuLaunchData *this_01;
  undefined1 auVar8 [16];
  Value VVar9;
  Value threads;
  Value thread;
  Data local_d8;
  Data local_c8;
  CpuConfig *local_b0;
  Document *local_a0;
  Data local_98;
  CpuBackend *local_80;
  Data local_78;
  StringRefType local_60;
  StringRefType local_50;
  StringRefType local_40;
  
  allocator = *(MemoryPoolAllocator<rapidjson::CrtAllocator> **)(in_RDX + 0x10);
  this_00 = Base::config(*(Base **)(doc->
                                   super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                   ).data_.s.str);
  pCVar4 = Config::cpu(this_00);
  (this->super_IBackend)._vptr_IBackend = (_func_int **)0x0;
  this->d_ptr = (CpuBackendPrivate *)0x0;
  *(undefined2 *)((long)&this->d_ptr + 6) = 3;
  (**(code **)((doc->
               super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ).data_.n.i64 + 0x28))(doc);
  String::toJSON((String *)&local_c8.s);
  local_d8.s.str = (Ch *)0x40500000018d27a;
  local_d8.n = (Number)0x4;
  local_b0 = pCVar4;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_d8.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_c8.s,allocator);
  bVar2 = (**(code **)((doc->
                       super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       ).data_.n.i64 + 0x10))(doc);
  local_c8.s.str = (Ch *)0x40500000018a227;
  local_c8.n = (Number)0x7;
  local_d8.n = (Number)0x0;
  local_d8.s.str = (Ch *)((ulong)(ushort)(bVar2 + 9) << 0x30);
  local_a0 = doc;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_c8.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_d8.s,allocator);
  pCVar4 = local_b0;
  bVar3 = CpuConfig::isHwAES(local_b0);
  pDVar7 = local_a0;
  local_c8.s.str = (Ch *)0x40500000018da6e;
  local_c8.n = (Number)0x6;
  local_d8.n = (Number)0x0;
  local_d8.s.str = (Ch *)((ulong)(ushort)(bVar3 + 9) << 0x30);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_c8.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_d8.s,allocator);
  local_40.s = "priority";
  local_40.length = 8;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<int>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)this,&local_40,pCVar4->m_priority,allocator);
  CpuBackendPrivate::hugePages
            ((CpuBackendPrivate *)&local_c8.s,
             (int)*(undefined8 *)
                   ((long)&(pDVar7->
                           super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           ).data_ + 8),(Document *)0x2);
  local_d8.s.str = (Ch *)0x40500000018da75;
  local_d8.n = (Number)0x9;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_d8.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_c8.s,allocator);
  local_50.s = "memory";
  local_50.length = 6;
  sVar5 = CpuBackendPrivate::ways
                    ((CpuBackendPrivate *)
                     (pDVar7->
                     super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ).data_.o.members);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_long>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)this,&local_50,sVar5 << 0x14,allocator);
  pCVar1 = (pDVar7->
           super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ).data_.s.str;
  uVar6 = extraout_RDX;
  if (*(long *)(pCVar1 + 0x48) != *(long *)(pCVar1 + 0x50)) {
    auVar8 = (**(code **)((pDVar7->
                          super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          ).data_.n.i64 + 0x20))(pDVar7);
    uVar6 = auVar8._8_8_;
    if (auVar8._0_8_ != 0) {
      doc_00 = (Document *)
               (**(code **)((pDVar7->
                            super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            ).data_.n.i64 + 0x20))(pDVar7);
      Hashrate::toJSON((Hashrate *)&local_c8.s,doc_00);
      local_d8.s.str = (Ch *)0x40500000018da86;
      local_d8.n = (Number)0x8;
      local_80 = this;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)&local_d8.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_c8.s,allocator);
      local_98.n = (Number)0x0;
      local_98.s.str = (Ch *)0x4000000000000;
      pCVar1 = (pDVar7->
               super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ).data_.s.str;
      this_01 = *(CpuLaunchData **)(pCVar1 + 0x48);
      local_b0 = *(CpuConfig **)(pCVar1 + 0x50);
      if ((CpuConfig *)this_01 != local_b0) {
        pDVar7 = (Document *)0x0;
        do {
          local_78.n.i64 = (Number)0x0;
          local_78.s.str = (Ch *)0x3000000000000;
          local_d8._4_1_ = '\0';
          local_d8._5_1_ = '\0';
          local_d8._6_1_ = '\0';
          local_d8._7_1_ = '\0';
          local_d8._0_4_ = this_01->intensity;
          local_c8.s.str = (Ch *)0x40500000018da8f;
          local_c8.n.i64 = (Number)0x9;
          local_d8.s.str = (Ch *)((ulong)(-1 < (int)this_01->intensity) << 0x35 | 0x1d6000000000000)
          ;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&local_78.s,
                      (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&local_c8.s,
                      (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&local_d8.s,allocator);
          local_d8.s.str = (Ch *)0x40500000018a26f;
          local_d8.n = (Number)0x8;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember<long>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)&local_78.s,
                            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)&local_d8.s,this_01->affinity,allocator);
          local_60.s = "av";
          local_60.length = 2;
          value = CpuLaunchData::av(this_01);
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember<xmrig::CnHash::AlgoVariant>
                    ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_78.s,&local_60,value,allocator);
          sVar5 = (**(code **)((local_a0->
                               super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                               ).data_.n.i64 + 0x20))();
          Hashrate::toJSON((Hashrate *)&local_c8.s,sVar5,pDVar7);
          local_d8.s.str = (Ch *)0x40500000018da86;
          local_d8.n = (Number)0x8;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&local_78.s,
                      (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&local_d8.s,
                      (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&local_c8.s,allocator);
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_98.s,
                     (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_78.s,allocator);
          pDVar7 = (Document *)
                   ((long)&(pDVar7->
                           super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           ).data_ + 1);
          this_01 = this_01 + 1;
        } while ((CpuConfig *)this_01 != local_b0);
      }
      this = local_80;
      local_d8.s.str = (Ch *)0x40500000018a29c;
      local_d8.n = (Number)0x7;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_80,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_d8.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_98.s,allocator);
      uVar6 = extraout_RDX_00;
    }
  }
  VVar9.data_.s.str = (Ch *)uVar6;
  VVar9.data_.n = (Number)this;
  return (Value)VVar9.data_;
}

Assistant:

rapidjson::Value xmrig::CpuBackend::toJSON(rapidjson::Document &doc) const
{
    using namespace rapidjson;
    auto &allocator         = doc.GetAllocator();
    const CpuConfig &cpu    = d_ptr->controller->config()->cpu();

    Value out(kObjectType);
    out.AddMember("type",       type().toJSON(), allocator);
    out.AddMember("enabled",    isEnabled(), allocator);
    out.AddMember("hw-aes",     cpu.isHwAES(), allocator);
    out.AddMember("priority",   cpu.priority(), allocator);

    out.AddMember("hugepages", d_ptr->hugePages(2, doc), allocator);
    out.AddMember("memory",    static_cast<uint64_t>(d_ptr->ways() * CnAlgo::CN_MEMORY), allocator);

    if (d_ptr->threads.empty() || !hashrate()) {
        return out;
    }

    out.AddMember("hashrate", hashrate()->toJSON(doc), allocator);

    Value threads(kArrayType);

    size_t i = 0;
    for (const CpuLaunchData &data : d_ptr->threads) {
        Value thread(kObjectType);
        thread.AddMember("intensity",   data.intensity, allocator);
        thread.AddMember("affinity",    data.affinity, allocator);
        thread.AddMember("av",          data.av(), allocator);
        thread.AddMember("hashrate",    hashrate()->toJSON(i, doc), allocator);

        i++;
        threads.PushBack(thread, allocator);
    }

    out.AddMember("threads", threads, allocator);

    return out;
}